

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

ly_bool lyd_validate_autodel_leaflist_dflt
                  (lyd_node **first,lyd_node **node,lys_module *mod,lyd_node **diff)

{
  bool bVar1;
  ly_bool lVar2;
  bool bVar3;
  ly_bool local_4a;
  ly_bool node_autodel;
  lyd_node *plStack_48;
  ly_bool found;
  lyd_node *next;
  lyd_node *iter;
  lysc_node *schema;
  lyd_node **diff_local;
  lys_module *mod_local;
  lyd_node **node_local;
  lyd_node **first_local;
  
  bVar1 = false;
  local_4a = '\0';
  schema = (lysc_node *)diff;
  diff_local = (lyd_node **)mod;
  mod_local = (lys_module *)node;
  node_local = first;
  if (((*node)->flags & 4) == 0) {
    __assert_fail("(*node)->flags & LYD_NEW",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                  ,0x2ee,
                  "ly_bool lyd_validate_autodel_leaflist_dflt(struct lyd_node **, struct lyd_node **, const struct lys_module *, struct lyd_node **)"
                 );
  }
  iter = (lyd_node *)(*node)->schema;
  if (((lysc_node *)iter)->nodetype != 8) {
    __assert_fail("schema->nodetype == LYS_LEAFLIST",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                  ,0x2f1,
                  "ly_bool lyd_validate_autodel_leaflist_dflt(struct lyd_node **, struct lyd_node **, const struct lys_module *, struct lyd_node **)"
                 );
  }
  lyd_find_sibling_val(*first,(lysc_node *)iter,(char *)0x0,0,&next);
  while( true ) {
    bVar3 = false;
    if (next != (lyd_node *)0x0) {
      bVar3 = next->schema == (lysc_node *)iter;
    }
    if (!bVar3) goto LAB_0022a756;
    if ((next->flags & 1) == 0) break;
    next = next->next;
  }
  bVar1 = true;
LAB_0022a756:
  if (bVar1) {
    next = (lyd_node *)0x0;
    plStack_48 = (lyd_node *)0x0;
    lyd_find_sibling_val(*node_local,(lysc_node *)iter,(char *)0x0,0,&next);
    while( true ) {
      if ((next == (lyd_node *)0x0) || (next->schema != (lysc_node *)iter)) {
        bVar1 = false;
      }
      else {
        plStack_48 = next->next;
        bVar1 = true;
      }
      if (!bVar1) break;
      if (((next->flags & 1) != 0) &&
         (lVar2 = lyd_validate_autodel_node_del
                            (node_local,next,(lys_module *)diff_local,0,(lyd_node **)mod_local,
                             (ly_set *)0x0,(ly_set *)0x0,(lyd_node **)schema), lVar2 != '\0')) {
        local_4a = '\x01';
      }
      next = plStack_48;
    }
    first_local._7_1_ = local_4a;
  }
  else {
    first_local._7_1_ = '\0';
  }
  return first_local._7_1_;
}

Assistant:

static ly_bool
lyd_validate_autodel_leaflist_dflt(struct lyd_node **first, struct lyd_node **node, const struct lys_module *mod,
        struct lyd_node **diff)
{
    const struct lysc_node *schema;
    struct lyd_node *iter, *next;
    ly_bool found = 0, node_autodel = 0;

    assert((*node)->flags & LYD_NEW);

    schema = (*node)->schema;
    assert(schema->nodetype == LYS_LEAFLIST);

    /* check whether there is any explicit instance */
    LYD_LIST_FOR_INST(*first, schema, iter) {
        if (!(iter->flags & LYD_DEFAULT)) {
            found = 1;
            break;
        }
    }
    if (!found) {
        /* no explicit instance, keep defaults as they are */
        return 0;
    }

    LYD_LIST_FOR_INST_SAFE(*first, schema, next, iter) {
        if (iter->flags & LYD_DEFAULT) {
            /* default instance found, remove it */
            if (lyd_validate_autodel_node_del(first, iter, mod, 0, node, NULL, NULL, diff)) {
                node_autodel = 1;
            }
        }
    }

    return node_autodel;
}